

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosixPath.cpp
# Opt level: O0

FileURL * __thiscall PosixPath::ToFileURL(FileURL *__return_storage_ptr__,PosixPath *this)

{
  bool bVar1;
  reference inComponent;
  _Self local_40;
  _Self local_38;
  const_iterator it;
  PosixPath *this_local;
  FileURL *aFileURL;
  
  FileURL::FileURL(__return_storage_ptr__);
  bVar1 = IsAbsolute(this);
  FileURL::SetIsAbsolute(__return_storage_ptr__,bVar1);
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->mPathComponents);
  while( true ) {
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->mPathComponents);
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    inComponent = std::
                  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&local_38);
    FileURL::PushPathComponent(__return_storage_ptr__,inComponent);
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

FileURL PosixPath::ToFileURL() const
{
    FileURL aFileURL;
    
    aFileURL.SetIsAbsolute(IsAbsolute());
    
    StringList::const_iterator it = mPathComponents.begin();
    
    for(; it != mPathComponents.end(); ++it)
        aFileURL.PushPathComponent(*it);
    
    return aFileURL;    
}